

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhash.c
# Opt level: O2

tommy_uint32_t tommy_strhash_u32(tommy_uint64_t init_val,void *void_key)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long in_FS_OFFSET;
  
  uVar5 = (int)init_val + 0xdeadbeef;
  uVar4 = uVar5;
  uVar2 = uVar5;
  do {
    uVar1 = *void_key;
    if ((~(0x1010100 - uVar1 | uVar1) & 0x80808080) != 0) {
      if (((uVar1 & 0xff) != 0) && (uVar5 = (uVar1 & 0xff) + uVar5, (uVar1 & 0xff00) != 0)) {
        uVar5 = (uVar1 & 0xffff00) + uVar5;
      }
LAB_0010e47e:
      if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
        __stack_chk_fail();
      }
      uVar1 = (uVar2 ^ uVar4) - (uVar4 << 0xe | uVar4 >> 0x12);
      uVar2 = (uVar5 ^ uVar1) - (uVar1 * 0x800 | uVar1 >> 0x15);
      uVar4 = (uVar4 ^ uVar2) - (uVar2 * 0x2000000 | uVar2 >> 7);
      uVar5 = (uVar1 ^ uVar4) - (uVar4 * 0x10000 | uVar4 >> 0x10);
      uVar2 = (uVar2 ^ uVar5) - (uVar5 * 0x10 | uVar5 >> 0x1c);
      uVar4 = (uVar4 ^ uVar2) - (uVar2 * 0x4000 | uVar2 >> 0x12);
      return (uVar5 ^ uVar4) - (uVar4 * 0x1000000 | uVar4 >> 8);
    }
    uVar5 = uVar1 + uVar5;
    uVar1 = *(uint *)((long)void_key + 4);
    if ((~(0x1010100 - uVar1 | uVar1) & 0x80808080) != 0) {
      if (((uVar1 & 0xff) != 0) && (uVar4 = uVar4 + (uVar1 & 0xff), (uVar1 & 0xff00) != 0)) {
        uVar4 = uVar4 + (uVar1 & 0xffff00);
      }
      goto LAB_0010e47e;
    }
    uVar4 = uVar1 + uVar4;
    uVar1 = *(uint *)((long)void_key + 8);
    if ((~(0x1010100 - uVar1 | uVar1) & 0x80808080) != 0) {
      if (((uVar1 & 0xff) != 0) && (uVar2 = uVar2 + (uVar1 & 0xff), (uVar1 & 0xff00) != 0)) {
        uVar2 = uVar2 + (uVar1 & 0xffff00);
      }
      goto LAB_0010e47e;
    }
    uVar1 = uVar1 + uVar2;
    uVar5 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^ uVar5 - uVar1;
    uVar2 = (uVar5 << 6 | uVar5 >> 0x1a) ^ uVar4 - uVar5;
    iVar6 = uVar5 + uVar1 + uVar4;
    uVar4 = (uVar2 << 8 | uVar2 >> 0x18) ^ (uVar1 + uVar4) - uVar2;
    iVar3 = uVar2 + iVar6;
    uVar5 = (uVar4 << 0x10 | uVar4 >> 0x10) ^ iVar6 - uVar4;
    iVar6 = uVar4 + iVar3;
    uVar4 = (uVar5 << 0x13 | uVar5 >> 0xd) ^ iVar3 - uVar5;
    uVar5 = uVar5 + iVar6;
    uVar2 = (uVar4 << 4 | uVar4 >> 0x1c) ^ iVar6 - uVar4;
    uVar4 = uVar4 + uVar5;
    void_key = (void *)((long)void_key + 0xc);
  } while( true );
}

Assistant:

tommy_uint32_t tommy_strhash_u32(tommy_uint64_t init_val, const void* void_key)
{
	const unsigned char* key = tommy_cast(const unsigned char*, void_key);
	tommy_uint32_t a, b, c;
	tommy_uint32_t m[3] = { 0xff, 0xff00, 0xff0000 };

	a = b = c = 0xdeadbeef + init_val;
	/* this is different than original lookup3 and the result won't match */

	while (1) {
		tommy_uint32_t v = tommy_le_uint32_read(key);

		if (tommy_haszero_u32(v)) {
			if (v & m[0]) {
				a += v & m[0];
				if (v & m[1]) {
					a += v & m[1];
					if (v & m[2])
						a += v & m[2];
				}
			}

			break;
		}

		a += v;

		v = tommy_le_uint32_read(key + 4);

		if (tommy_haszero_u32(v)) {
			if (v & m[0]) {
				b += v & m[0];
				if (v & m[1]) {
					b += v & m[1];
					if (v & m[2])
						b += v & m[2];
				}
			}

			break;
		}

		b += v;

		v = tommy_le_uint32_read(key + 8);

		if (tommy_haszero_u32(v)) {
			if (v & m[0]) {
				c += v & m[0];
				if (v & m[1]) {
					c += v & m[1];
					if (v & m[2])
						c += v & m[2];
				}
			}

			break;
		}

		c += v;

		tommy_mix(a, b, c);

		key += 12;
	}

	/* for lengths that are multiplers of 12 we already have called mix */
	/* this is different than the original lookup3 and the result won't match */

	tommy_final(a, b, c);

	return c;
}